

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  SerialArenaChunk *pSVar1;
  SerialArena *this_00;
  SerialArenaChunk *this_01;
  ulong uVar2;
  void *pvVar3;
  Nonnull<const_char_*> pcVar4;
  long lVar5;
  GetDeallocator deallocator;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar6;
  SizedPtr SVar7;
  
  uVar2 = (this->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar2 == 0) {
    deallocator.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    deallocator.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar2 + 0x18);
  }
  this_01 = (this->head_)._M_b._M_p;
  do {
    if (((ulong)this_01 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_01 + 8) == 0) {
      SVar7 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                        (&this->first_arena_,deallocator);
      return SVar7;
    }
    pSVar1 = *(SerialArenaChunk **)this_01;
    SVar6 = SerialArenaChunk::arenas(this_01);
    if (SVar6.len_ != 0) {
      lVar5 = SVar6.len_ << 3;
      do {
        this_00 = *(SerialArena **)((long)&SVar6.ptr_[-1]._M_b._M_p + lVar5);
        if (this_00 == (SerialArena *)0x0) {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                             ((void *)0x0,(void *)0x0,"serial != nullptr");
        }
        else {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) {
          Free();
LAB_001f51f6:
          Free();
        }
        SVar7 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                          (this_00,deallocator);
        pvVar3 = SVar7.p;
        if (pvVar3 == (void *)0x0) {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                             ((void *)0x0,(void *)0x0,"mem.p != nullptr");
        }
        else {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_001f51f6;
        if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
          operator_delete(pvVar3,SVar7.n);
        }
        else {
          (*deallocator.dealloc_)(pvVar3,SVar7.n);
        }
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
    operator_delete(this_01,(ulong)*(uint *)(this_01 + 8) * 0x10 + 0x10);
    this_01 = pSVar1;
  } while( true );
}

Assistant:

inline size_t AllocationSize(size_t last_size, size_t start_size,
                             size_t max_size) {
  if (last_size == 0) return start_size;
  // Double the current block size, up to a limit.
  return std::min(2 * last_size, max_size);
}